

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O0

string * __thiscall util::Lexer::ReadToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  reference pvVar2;
  function<bool_(char)> local_40;
  char local_19;
  Lexer *pLStack_18;
  char c;
  Lexer *this_local;
  string *token;
  
  pLStack_18 = this;
  this_local = (Lexer *)__return_storage_ptr__;
  do {
    std::function<bool(char)>::function<bool(&)(char),void>
              ((function<bool(char)> *)&local_40,ctype_whitespace);
    bVar1 = GetCharIf(this,&local_19,&local_40);
    std::function<bool_(char)>::~function(&local_40);
  } while (bVar1);
  bVar1 = std::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->token_buffer);
  if (bVar1) {
    bVar1 = PeekChar(this,&local_19);
    if (bVar1) {
      bVar1 = ctype_op(local_19);
      if (bVar1) {
        ReadOperator_abi_cxx11_(__return_storage_ptr__,this);
      }
      else {
        ReadValue_abi_cxx11_(__return_storage_ptr__,this);
      }
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
  }
  else {
    pvVar2 = std::
             queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::front(&this->token_buffer);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
    std::
    queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop(&this->token_buffer);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::ReadToken()
	{
		char c;

		while (this->GetCharIf(c, ctype_whitespace)) ; // no loop body

		if (!this->token_buffer.empty())
		{
			std::string token = this->token_buffer.front();
			this->token_buffer.pop();
			return token;
		}

		if (this->PeekChar(c))
		{
			if (ctype_op(c))
			{
				return this->ReadOperator();
			}
			else
			{
				return this->ReadValue();
			}
		}

		return {};
	}